

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O1

void __thiscall DictionaryStats::DictionaryStats(DictionaryStats *this,char *name,uint bucketCount)

{
  char cVar1;
  long lVar2;
  int iVar3;
  DictionaryType *__s;
  long lVar4;
  long lVar5;
  
  this->pNext = (DictionaryStats *)0x0;
  this->initialSize = bucketCount;
  this->finalSize = bucketCount;
  this->countOfEmptyBuckets = bucketCount;
  this->countOfResize = 0;
  this->itemCount = 0;
  this->maxDepth = 0;
  this->lookupCount = 0;
  this->collisionCount = 0;
  this->lookupDepthTotal = 0;
  *(undefined8 *)&this->maxLookupDepth = 0;
  *(undefined4 *)((long)&this->pName + 4) = 0;
  CCLock::Enter(&dictionaryTypesCriticalSection.super_CCLock);
  for (__s = dictionaryTypes; __s != (DictionaryType *)0x0; __s = __s->pNext) {
    iVar3 = strncmp(name,__s->name,0xff);
    if (iVar3 == 0) goto LAB_006992c1;
  }
  __s = (DictionaryType *)0x0;
LAB_006992c1:
  if (__s != (DictionaryType *)0x0) goto LAB_00699399;
  __s = (DictionaryType *)
        Memory::NoCheckHeapAllocator::Alloc
                  ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,0x118);
  memset(__s,0,0x118);
  __s->pNext = dictionaryTypes;
  dictionaryTypes = __s;
  __s->instancesCount = 0;
  if (name == (char *)0x0) {
LAB_00699366:
    __s->name[0] = '\0';
    memset(__s->name + 1,0xfd,0xff);
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
  }
  else {
    lVar4 = 0x100;
    lVar2 = 0;
    do {
      lVar5 = lVar2;
      cVar1 = name[lVar5];
      __s->name[lVar5] = cVar1;
      if (cVar1 == '\0') goto LAB_00699335;
      lVar4 = lVar4 + -1;
      lVar2 = lVar5 + 1;
    } while (lVar5 + 1 != 0xff);
    lVar4 = 1;
LAB_00699335:
    if (cVar1 != '\0') {
      __s->name[lVar5 + 1] = '\0';
    }
    if (lVar4 == 0) goto LAB_00699366;
    if (-lVar4 + 0x101U < 0x100) {
      memset((void *)((long)__s + -lVar4 + 0x111),0xfd,lVar4 - 1);
    }
  }
  __s->name[0xff] = '\0';
LAB_00699399:
  CCLock::Leave(&dictionaryTypesCriticalSection.super_CCLock);
  this->pName = __s->name;
  this->pNext = __s->instances;
  __s->instances = this;
  __s->instancesCount = __s->instancesCount + 1;
  return;
}

Assistant:

DictionaryStats::DictionaryStats(const char* name, uint bucketCount)
    :
    initialSize(bucketCount),
    finalSize(bucketCount),
    countOfEmptyBuckets(bucketCount),
    countOfResize(0),
    itemCount(0),
    maxDepth(0),
    lookupCount(0),
    collisionCount(0),
    lookupDepthTotal(0),
    maxLookupDepth(0),
    pNext(NULL),
    pName(NULL)
{
    DictionaryStats::dictionaryTypesCriticalSection.Enter();
    DictionaryType* type = NULL;
    // See if we already created instance(s) of this type
    DictionaryType* current = dictionaryTypes;
    while(current)
    {
        if (strncmp(name, current->name, _countof(current->name)-1) == 0)
        {
            type = current;
            break;
        }
        current = current->pNext;
    }

    if (!type)
    {
        // We haven't seen this type before so add a new entry for it
        type = NoCheckHeapNew(DictionaryType);
        type->pNext = dictionaryTypes;
        dictionaryTypes = type;
        type->instancesCount = 0;
        strncpy_s(type->name, name, _countof(type->name)-1);
        type->name[sizeof(type->name)-1]='\0';
    }
    dictionaryTypesCriticalSection.Leave();
    // keep a pointer to the name in case we are asked to clone ourselves
    pName = type->name;

    // Add ourself in the list
    pNext = type->instances;
    type->instances = this;
    ++(type->instancesCount);
}